

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorPool::Tables::FindAllExtensions
          (Tables *this,Descriptor *extendee,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *out)

{
  const_iterator cVar1;
  key_type local_30;
  
  local_30.second = 0;
  local_30.first = extendee;
  cVar1 = std::
          _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
          ::lower_bound(&(this->extensions_)._M_t,&local_30);
  for (; ((_Rb_tree_header *)cVar1._M_node !=
          &(this->extensions_)._M_t._M_impl.super__Rb_tree_header &&
         (*(Descriptor **)(cVar1._M_node + 1) == extendee));
      cVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar1._M_node)) {
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back(out,(value_type *)&cVar1._M_node[1]._M_left);
  }
  return;
}

Assistant:

inline void DescriptorPool::Tables::FindAllExtensions(
    const Descriptor* extendee,
    std::vector<const FieldDescriptor*>* out) const {
  ExtensionsGroupedByDescriptorMap::const_iterator it =
      extensions_.lower_bound(std::make_pair(extendee, 0));
  for (; it != extensions_.end() && it->first.first == extendee; ++it) {
    out->push_back(it->second);
  }
}